

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

LabelInstr * __thiscall
FlowGraph::DeleteLeaveChainBlocks(FlowGraph *this,BranchInstr *leaveInstr,Instr **instrPrev)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  LabelInstr *pLVar7;
  LabelInstr *this_00;
  LabelInstr *this_01;
  Instr *local_38;
  
  this_01 = leaveInstr->m_branchTarget;
  pIVar5 = IR::Instr::GetNextBranchOrLabel(&this_01->super_Instr);
  if (pIVar5->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x19,"(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr())",
                       "leaveTarget->GetNextBranchOrLabel()->IsBranchInstr()");
    if (!bVar4) goto LAB_0040de2f;
    *puVar6 = 0;
  }
  local_38 = IR::Instr::GetNextBranchOrLabel(&this_01->super_Instr);
  if (local_38->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar4) goto LAB_0040de2f;
    *puVar6 = 0;
  }
  IVar1 = (this_01->super_Instr).m_kind;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar4) {
LAB_0040de2f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_0040dbd8:
  OVar2 = local_38->m_opcode;
  if ((OVar2 != Leave) && (OVar2 != BrOnException)) {
    if (OVar2 == Br) {
      *instrPrev = local_38->m_next;
      pLVar7 = (LabelInstr *)local_38[1].m_next;
      RemoveBlock(this,this_01->m_block,(GlobOpt *)0x0,false);
      return pLVar7;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x1f,
                       "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                       ,
                       "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                      );
    if (!bVar4) goto LAB_0040de2f;
    *puVar6 = 0;
  }
  pLVar7 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(local_38);
  pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)pLVar7);
  IVar1 = pIVar5->m_kind;
  local_38 = IR::Instr::GetNextRealInstrOrLabel((Instr *)pLVar7);
  if (IVar1 == InstrKindBranch) {
    IVar1 = local_38->m_kind;
  }
  else {
    this_00 = pLVar7;
    if (local_38->m_opcode != ProfiledLoopEnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x24,
                         "(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                         ,
                         "nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                        );
      if (!bVar4) goto LAB_0040de2f;
      *puVar6 = 0;
    }
    while( true ) {
      this_00 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&this_00->super_Instr);
      pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)this_00);
      if (pIVar5->m_kind == InstrKindBranch) break;
      if ((this_00->super_Instr).m_opcode != ProfiledLoopEnd) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x28,"(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                           "loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd");
        if (!bVar4) goto LAB_0040de2f;
        *puVar6 = 0;
      }
    }
    local_38 = IR::Instr::GetNextRealInstrOrLabel((Instr *)this_00);
    IVar1 = local_38->m_kind;
  }
  if (IVar1 != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar4) goto LAB_0040de2f;
    *puVar6 = 0;
  }
  RemoveBlock(this,this_01->m_block,(GlobOpt *)0x0,false);
  IVar1 = (pLVar7->super_Instr).m_kind;
  this_01 = pLVar7;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar4) goto LAB_0040de2f;
    *puVar6 = 0;
  }
  goto LAB_0040dbd8;
}

Assistant:

IR::LabelInstr * FlowGraph::DeleteLeaveChainBlocks(IR::BranchInstr *leaveInstr, IR::Instr * &instrPrev)
{
    // Cleanup Rest of the Leave chain
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr());
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();
    IR::LabelInstr * curLabel = leaveTarget->AsLabelInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::Instr * nextLabel = leaveChain->GetNextRealInstrOrLabel();
        if (!nextLabel->GetNextRealInstrOrLabel()->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd);
            IR::Instr * loopEnd = nextLabel->GetNextRealInstrOrLabel();
            while (!loopEnd->GetNextRealInstrOrLabel()->IsBranchInstr())
            {
                Assert(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd);
                loopEnd = loopEnd->GetNextRealInstrOrLabel();
            }
            leaveChain = loopEnd->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        else
        {
            leaveChain = nextLabel->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        BasicBlock *curBlock = curLabel->GetBasicBlock();
        this->RemoveBlock(curBlock);
        curLabel = nextLabel->AsLabelInstr();
    }

    instrPrev = leaveChain->m_next;
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    BasicBlock * curBlock = curLabel->GetBasicBlock();
    this->RemoveBlock(curBlock);
    return exitLabel;
}